

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadSemaphorePosix.cpp
# Opt level: O3

void __thiscall IlmThread_2_5::Semaphore::~Semaphore(Semaphore *this)

{
  ~Semaphore(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

Semaphore::~Semaphore ()
{
#ifdef NDEBUG
    ::sem_destroy (&_semaphore);
#else
    int error = ::sem_destroy (&_semaphore);
    assert (error == 0);
#endif
}